

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O3

int wallet::CalculateMaximumSignedInputSize
              (CTxOut *txout,CWallet *wallet,CCoinControl *coin_control)

{
  COutPoint outpoint;
  WalletStorage provider;
  bool can_grind_r;
  int iVar1;
  long in_FS_OFFSET;
  WalletStorage local_58;
  Notifications local_50;
  pointer puStack_48;
  pointer local_40;
  pointer puStack_38;
  uint32_t local_30;
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  local_28;
  
  local_28._M_i.__d.__r =
       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        )((duration *)(in_FS_OFFSET + 0x28))->__r;
  CWallet::GetSolvingProvider((CWallet *)&stack0xffffffffffffffa8,(CScript *)wallet);
  provider._vptr_WalletStorage = local_58._vptr_WalletStorage;
  can_grind_r = CWallet::CanGrindR(wallet);
  outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ = puStack_48;
  outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = local_50._vptr_Notifications
  ;
  outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ = local_40;
  outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = puStack_38;
  outpoint.n = local_30;
  iVar1 = CalculateMaximumSignedInputSize
                    (txout,outpoint,(SigningProvider *)provider._vptr_WalletStorage,can_grind_r,
                     coin_control);
  if ((SigningProvider *)local_58._vptr_WalletStorage != (SigningProvider *)0x0) {
    (**(_func_int **)((long)*local_58._vptr_WalletStorage + 8))();
  }
  if ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
       )((duration *)(in_FS_OFFSET + 0x28))->__r == local_28._M_i.__d.__r) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int CalculateMaximumSignedInputSize(const CTxOut& txout, const CWallet* wallet, const CCoinControl* coin_control)
{
    const std::unique_ptr<SigningProvider> provider = wallet->GetSolvingProvider(txout.scriptPubKey);
    return CalculateMaximumSignedInputSize(txout, COutPoint(), provider.get(), wallet->CanGrindR(), coin_control);
}